

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

void Kit_DsdTest(uint *pTruth,int nVars)

{
  int iVar1;
  Kit_DsdNtk_t *p_00;
  Kit_DsdNtk_t *pNtk_00;
  Kit_DsdMan_t *p_01;
  uint *pIn1;
  Kit_DsdNtk_t *pTemp;
  Kit_DsdNtk_t *pNtk;
  uint *pTruthC;
  Kit_DsdMan_t *p;
  int nVars_local;
  uint *pTruth_local;
  
  p_00 = Kit_DsdDecompose(pTruth,nVars);
  pNtk_00 = Kit_DsdExpand(p_00);
  Kit_DsdNtkFree(p_00);
  Kit_DsdPrint(_stdout,pNtk_00);
  printf("\n");
  iVar1 = Kit_DsdNtkObjNum(pNtk_00);
  p_01 = Kit_DsdManAlloc(nVars,iVar1);
  pIn1 = Kit_DsdTruthCompute(p_01,pNtk_00);
  iVar1 = Extra_TruthIsEqual(pTruth,pIn1,nVars);
  if (iVar1 == 0) {
    printf("Verification failed.\n");
  }
  Kit_DsdManFree(p_01);
  Kit_DsdNtkFree(pNtk_00);
  return;
}

Assistant:

void Kit_DsdTest( unsigned * pTruth, int nVars )
{
    Kit_DsdMan_t * p;
    unsigned * pTruthC;
    Kit_DsdNtk_t * pNtk, * pTemp;
    pNtk = Kit_DsdDecompose( pTruth, nVars );

//    if ( Kit_DsdFindLargeBox(pNtk, Abc_Lit2Var(pNtk->Root)) )
//        Kit_DsdPrint( stdout, pNtk );

//    if ( Kit_DsdNtkRoot(pNtk)->nFans == (unsigned)nVars && nVars == 6 )

//    printf( "\n" );
//    Kit_DsdPrint( stdout, pNtk );

    pNtk = Kit_DsdExpand( pTemp = pNtk );
    Kit_DsdNtkFree( pTemp );

    Kit_DsdPrint( stdout, pNtk ), printf( "\n" );

//    if ( Kit_DsdFindLargeBox(pNtk, Abc_Lit2Var(pNtk->Root)) )
//        Kit_DsdTestCofs( pNtk, pTruth );

    // recompute the truth table
    p = Kit_DsdManAlloc( nVars, Kit_DsdNtkObjNum(pNtk) );
    pTruthC = Kit_DsdTruthCompute( p, pNtk );
//    Extra_PrintBinary( stdout, pTruth, 1 << nVars ); printf( "\n" );
//    Extra_PrintBinary( stdout, pTruthC, 1 << nVars ); printf( "\n" );
    if ( Extra_TruthIsEqual( pTruth, pTruthC, nVars ) )
    {
//        printf( "Verification is okay.\n" );
    }
    else
        printf( "Verification failed.\n" );
    Kit_DsdManFree( p );


    Kit_DsdNtkFree( pNtk );
}